

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O2

EncFrmStatus * get_ref_from_cpb(EncVirtualCpb *cpb,EncFrmStatus *frm)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  EncFrmStatus *pEVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  bool bVar8;
  
  uVar1 = frm->val;
  if ((uVar1 & 0x20) == 0) {
    uVar5 = (uint)(uVar1 >> 0x10) & 0x3f;
    if (uVar5 < 7) {
      lVar6 = (long)(char)(uVar1 >> 0x16);
      switch((ulong)uVar5) {
      default:
        pEVar4 = cpb->mode_refs + uVar5;
        break;
      case 4:
        pEVar4 = cpb->st_tid_refs + lVar6;
        break;
      case 5:
        pEVar4 = cpb->lt_idx_refs + lVar6;
        break;
      case 6:
        pEVar4 = cpb->cpb_refs + lVar6;
      }
      uVar2 = pEVar4->val;
      if ((uVar2 & 1) == 0) {
        _mpp_log_l(2,"mpp_enc_refs","frm %d found mode %d arg %d -> ref %d but it is invalid\n",
                   "get_ref_from_cpb",uVar1 >> 0x30,(ulong)uVar5,lVar6,uVar2 >> 0x30);
      }
      else if (((byte)enc_refs_debug & 2) != 0) {
        bVar8 = -1 < (char)uVar2;
        pcVar7 = "lt";
        if (bVar8) {
          pcVar7 = "st";
        }
        uVar3 = (uint)(uVar2 >> 8) & 0xf;
        if (bVar8) {
          uVar3 = 0;
        }
        _mpp_log_l(4,"mpp_enc_refs","frm %d ref mode %d arg %d -> seq %d %s idx %d\n",
                   "get_ref_from_cpb",uVar1 >> 0x30,(ulong)uVar5,lVar6,uVar2 >> 0x30,pcVar7,
                   (ulong)uVar3);
      }
    }
    else {
      pEVar4 = (EncFrmStatus *)0x0;
      _mpp_log_l(2,"mpp_enc_refs","frm %d not supported ref mode 0x%x\n","get_ref_from_cpb",
                 uVar1 >> 0x30);
    }
  }
  else {
    pEVar4 = (EncFrmStatus *)0x0;
  }
  return pEVar4;
}

Assistant:

static EncFrmStatus *get_ref_from_cpb(EncVirtualCpb *cpb, EncFrmStatus *frm)
{
    MppEncRefMode ref_mode = frm->ref_mode;
    RK_S32 ref_arg = frm->ref_arg;

    if (frm->is_idr)
        return NULL;

    EncFrmStatus *ref = NULL;

    /* step 3.1 find seq_idx by mode and arg */
    switch (ref_mode) {
    case REF_TO_PREV_REF_FRM :
    case REF_TO_PREV_ST_REF :
    case REF_TO_PREV_LT_REF :
    case REF_TO_PREV_INTRA : {
        ref = &cpb->mode_refs[ref_mode];
    } break;
    case REF_TO_TEMPORAL_LAYER : {
        ref = &cpb->st_tid_refs[ref_arg];
    } break;
    case REF_TO_LT_REF_IDX : {
        ref = &cpb->lt_idx_refs[ref_arg];
    } break;
    case REF_TO_ST_PREV_N_REF : {
        ref = &cpb->cpb_refs[ref_arg];
    } break;
    case REF_TO_ST_REF_SETUP :
    default : {
        mpp_err_f("frm %d not supported ref mode 0x%x\n", frm->seq_idx, ref_mode);
    } break;
    }

    if (ref) {
        if (ref->valid)
            enc_refs_dbg_flow("frm %d ref mode %d arg %d -> seq %d %s idx %d\n",
                              frm->seq_idx, ref_mode, ref_arg, ref->seq_idx,
                              ref->is_lt_ref ? "lt" : "st",
                              ref->is_lt_ref ? ref->lt_idx : 0);
        else
            mpp_err_f("frm %d found mode %d arg %d -> ref %d but it is invalid\n",
                      frm->seq_idx, ref_mode, ref_arg, ref->seq_idx);
    } else {
        ref = NULL;
    }

    return ref;
}